

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clock.cpp
# Opt level: O0

Clock * Clock::getInstance(void)

{
  Clock *this;
  
  if (instance == (Clock *)0x0) {
    this = (Clock *)operator_new(0x10);
    Clock(this);
    instance = this;
  }
  return instance;
}

Assistant:

Clock* Clock::getInstance()
{
    if (instance == 0) {
        instance = new Clock();
    }
    return instance;
}